

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O2

void __thiscall CFG::eliminateNonReachableSymbols(CFG *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  vector<Production_*,_std::allocator<Production_*>_> *this_01;
  string *s;
  pointer pbVar1;
  pointer ppPVar2;
  bool bVar3;
  ostream *poVar4;
  char *this_02;
  CFG *this_03;
  int iVar5;
  ulong uVar6;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_f9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reachableSymbols;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  CFG local_b8;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_d8,(string *)&this->startS);
  __l._M_len = 1;
  __l._M_array = &local_d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&reachableSymbols,__l,&local_f9);
  std::__cxx11::string::~string((string *)&local_d8);
  do {
    bVar3 = expandReachableSymbols(this,&reachableSymbols);
  } while (bVar3);
  this_02 = "Reachable symbols: ";
  poVar4 = std::operator<<((ostream *)&std::cout,"Reachable symbols: ");
  vecToStr(&local_d8,(CFG *)this_02,&reachableSymbols);
  poVar4 = std::operator<<(poVar4,(string *)&local_d8);
  std::endl<char,std::char_traits<char>>(poVar4);
  std::__cxx11::string::~string((string *)&local_d8);
  iVar5 = 0;
  this_01 = &local_b8.productionsP;
  while( true ) {
    uVar6 = (ulong)iVar5;
    pbVar1 = (this->nonTerminalsV).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->nonTerminalsV).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar6)
    break;
    std::__cxx11::string::string((string *)&local_50,(string *)(pbVar1 + uVar6));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)this_01,&reachableSymbols);
    bVar3 = inVector(&local_50,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_01);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_01);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&this->nonTerminalsV,
              (this->nonTerminalsV).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar6);
      iVar5 = iVar5 + -1;
    }
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  s = &local_b8.startS;
  this_00 = &local_b8.terminalsT;
  while( true ) {
    uVar6 = (ulong)iVar5;
    pbVar1 = (this->terminalsT).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->terminalsT).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar6)
    break;
    std::__cxx11::string::string((string *)s,(string *)(pbVar1 + uVar6));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(this_00,&reachableSymbols);
    bVar3 = inVector(s,this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_00);
    std::__cxx11::string::~string((string *)s);
    if (!bVar3) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::erase(&this->terminalsT,
              (this->terminalsT).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar6);
      iVar5 = iVar5 + -1;
    }
    iVar5 = iVar5 + 1;
  }
  iVar5 = 0;
  while( true ) {
    uVar6 = (ulong)iVar5;
    ppPVar2 = (this->productionsP).super__Vector_base<Production_*,_std::allocator<Production_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->productionsP).
                      super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppPVar2 >> 3) <= uVar6) break;
    this_03 = &local_b8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_b8.nonTerminalsV,&reachableSymbols);
    bVar3 = reachableProduction(this_03,ppPVar2 + uVar6,&local_b8.nonTerminalsV);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8.nonTerminalsV);
    if (!bVar3) {
      std::vector<Production_*,_std::allocator<Production_*>_>::erase
                (&this->productionsP,
                 (const_iterator)
                 ((this->productionsP).
                  super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                  super__Vector_impl_data._M_start + uVar6));
      iVar5 = iVar5 + -1;
    }
    iVar5 = iVar5 + 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&reachableSymbols);
  return;
}

Assistant:

void CFG::eliminateNonReachableSymbols() {
    // Find all reachable symbols (and thus also the nonreachable)
    std::vector<std::string> reachableSymbols = {startS};
    while (expandReachableSymbols(reachableSymbols)) {}

    std::cout << "Reachable symbols: " << vecToStr(reachableSymbols) << std::endl;

    // Remove all non-reachable symbols from variables, terminals and productions
    for (int i = 0; i < nonTerminalsV.size(); ++i) {
        if (!inVector(nonTerminalsV[i], reachableSymbols)) {
            nonTerminalsV.erase(nonTerminalsV.begin() + i);
            --i;
        }
    }

    for (int i = 0; i < terminalsT.size(); ++i) {
        if (!inVector(terminalsT[i], reachableSymbols)) {
            terminalsT.erase(terminalsT.begin() + i);
            --i;
        }
    }


    for (int j = 0; j < productionsP.size(); ++j) {
        if (!reachableProduction(productionsP[j], reachableSymbols)) {
            productionsP.erase(productionsP.begin() + j);
            --j;
        }
    }
}